

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O3

int ssl_ciphersuite_match
              (mbedtls_ssl_context *ssl,int suite_id,mbedtls_ssl_ciphersuite_t **ciphersuite_info)

{
  uint uVar1;
  mbedtls_ssl_config *pmVar2;
  mbedtls_ssl_key_cert *pmVar3;
  int iVar4;
  mbedtls_pk_type_t type;
  mbedtls_ssl_ciphersuite_t *info;
  mbedtls_ecp_curve_info **ppmVar5;
  mbedtls_ecp_curve_info *pmVar6;
  char *pcVar7;
  mbedtls_x509_crt *crt;
  mbedtls_ssl_key_cert *pmVar8;
  mbedtls_ssl_key_cert *local_40;
  uint32_t local_34;
  
  info = mbedtls_ssl_ciphersuite_from_id(suite_id);
  if (info == (mbedtls_ssl_ciphersuite_t *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x2cc,"should never happen");
    return -0x6c00;
  }
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,0x2d0,"trying ciphersuite: %s",info->name);
  if ((ssl->minor_ver < info->min_minor_ver) || (info->max_minor_ver < ssl->minor_ver)) {
    pcVar7 = "ciphersuite mismatch: version";
    iVar4 = 0x2d5;
  }
  else {
    uVar1 = *(uint *)&ssl->conf->field_0x174;
    if (((uVar1 & 2) != 0) && ((info->flags & 4) != 0)) {
      return 0;
    }
    if (((uVar1 & 0x40) == 0) || (info->cipher != MBEDTLS_CIPHER_ARC4_128)) {
      iVar4 = mbedtls_ssl_ciphersuite_uses_ec(info);
      if ((iVar4 == 0) ||
         ((ppmVar5 = ssl->handshake->curves, ppmVar5 != (mbedtls_ecp_curve_info **)0x0 &&
          (*ppmVar5 != (mbedtls_ecp_curve_info *)0x0)))) {
        iVar4 = mbedtls_ssl_ciphersuite_uses_psk(info);
        if (((iVar4 == 0) ||
            (pmVar2 = ssl->conf,
            pmVar2->f_psk != (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0)) ||
           ((((pmVar2->psk != (uchar *)0x0 && (pmVar2->psk_identity != (uchar *)0x0)) &&
             (pmVar2->psk_identity_len != 0)) && (pmVar2->psk_len != 0)))) {
          type = mbedtls_ssl_get_ciphersuite_sig_pk_alg(info);
          pmVar8 = ssl->handshake->sni_key_cert;
          if (pmVar8 == (mbedtls_ssl_key_cert *)0x0) {
            pmVar8 = ssl->conf->key_cert;
          }
          if (type == MBEDTLS_PK_NONE) {
LAB_001214ef:
            *ciphersuite_info = info;
            return 0;
          }
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0x26f,"ciphersuite requires certificate");
          if (pmVar8 == (mbedtls_ssl_key_cert *)0x0) {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0x273,"server has no certificate");
          }
          else {
            local_40 = (mbedtls_ssl_key_cert *)0x0;
            do {
              mbedtls_debug_print_crt
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                         ,0x27a,"candidate certificate chain, certificate",pmVar8->cert);
              iVar4 = mbedtls_pk_can_do(pmVar8->key,type);
              if (iVar4 == 0) {
                iVar4 = 0x27e;
                pcVar7 = "certificate mismatch: key type";
              }
              else {
                iVar4 = mbedtls_ssl_check_cert_usage(pmVar8->cert,info,1,&local_34);
                if (iVar4 == 0) {
                  if (type == MBEDTLS_PK_ECDSA) {
                    ppmVar5 = ssl->handshake->curves;
                    pmVar6 = *ppmVar5;
                    if (pmVar6 != (mbedtls_ecp_curve_info *)0x0) {
                      do {
                        ppmVar5 = ppmVar5 + 1;
                        if (pmVar6->grp_id == *pmVar8->key->pk_ctx) goto LAB_0012145e;
                        pmVar6 = *ppmVar5;
                      } while (pmVar6 != (mbedtls_ecp_curve_info *)0x0);
                    }
                    iVar4 = 0x296;
                    pcVar7 = "certificate mismatch: elliptic curve";
                  }
                  else {
LAB_0012145e:
                    pmVar3 = pmVar8;
                    if (2 < ssl->minor_ver) break;
                    crt = pmVar8->cert;
                    if (crt->sig_md == MBEDTLS_MD_SHA1) goto LAB_001214c4;
                    if (local_40 == (mbedtls_ssl_key_cert *)0x0) {
                      local_40 = pmVar8;
                    }
                    iVar4 = 0x2a7;
                    pcVar7 = "certificate not preferred: sha-2 with pre-TLS 1.2 client";
                  }
                }
                else {
                  iVar4 = 0x28e;
                  pcVar7 = "certificate mismatch: (extended) key usage extension";
                }
              }
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                         ,iVar4,pcVar7);
              pmVar8 = pmVar8->next;
              pmVar3 = local_40;
            } while (pmVar8 != (mbedtls_ssl_key_cert *)0x0);
            local_40 = pmVar3;
            if (local_40 != (mbedtls_ssl_key_cert *)0x0) {
              crt = local_40->cert;
              pmVar8 = local_40;
LAB_001214c4:
              ssl->handshake->key_cert = pmVar8;
              mbedtls_debug_print_crt
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                         ,0x2b8,"selected certificate chain, certificate",crt);
              goto LAB_001214ef;
            }
          }
          pcVar7 = "ciphersuite mismatch: no suitable certificate";
          iVar4 = 0x316;
        }
        else {
          pcVar7 = "ciphersuite mismatch: no pre-shared key";
          iVar4 = 0x306;
        }
      }
      else {
        pcVar7 = "ciphersuite mismatch: no common elliptic curve";
        iVar4 = 0x2f9;
      }
    }
    else {
      pcVar7 = "ciphersuite mismatch: rc4";
      iVar4 = 0x2e3;
    }
  }
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,iVar4,pcVar7);
  return 0;
}

Assistant:

static int ssl_ciphersuite_match( mbedtls_ssl_context *ssl, int suite_id,
                                  const mbedtls_ssl_ciphersuite_t **ciphersuite_info )
{
    const mbedtls_ssl_ciphersuite_t *suite_info;

    suite_info = mbedtls_ssl_ciphersuite_from_id( suite_id );
    if( suite_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "trying ciphersuite: %s", suite_info->name ) );

    if( suite_info->min_minor_ver > ssl->minor_ver ||
        suite_info->max_minor_ver < ssl->minor_ver )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: version" ) );
        return( 0 );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ( suite_info->flags & MBEDTLS_CIPHERSUITE_NODTLS ) )
        return( 0 );
#endif

#if defined(MBEDTLS_ARC4_C)
    if( ssl->conf->arc4_disabled == MBEDTLS_SSL_ARC4_DISABLED &&
            suite_info->cipher == MBEDTLS_CIPHER_ARC4_128 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: rc4" ) );
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if( suite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE &&
        ( ssl->handshake->cli_exts & MBEDTLS_TLS_EXT_ECJPAKE_KKPP_OK ) == 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: ecjpake "
                                    "not configured or ext missing" ) );
        return( 0 );
    }
#endif


#if defined(MBEDTLS_ECDH_C) || defined(MBEDTLS_ECDSA_C)
    if( mbedtls_ssl_ciphersuite_uses_ec( suite_info ) &&
        ( ssl->handshake->curves == NULL ||
          ssl->handshake->curves[0] == NULL ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: "
                            "no common elliptic curve" ) );
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    /* If the ciphersuite requires a pre-shared key and we don't
     * have one, skip it now rather than failing later */
    if( mbedtls_ssl_ciphersuite_uses_psk( suite_info ) &&
        ssl->conf->f_psk == NULL &&
        ( ssl->conf->psk == NULL || ssl->conf->psk_identity == NULL ||
          ssl->conf->psk_identity_len == 0 || ssl->conf->psk_len == 0 ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: no pre-shared key" ) );
        return( 0 );
    }
#endif

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    /*
     * Final check: if ciphersuite requires us to have a
     * certificate/key of a particular type:
     * - select the appropriate certificate if we have one, or
     * - try the next ciphersuite if we don't
     * This must be done last since we modify the key_cert list.
     */
    if( ssl_pick_cert( ssl, suite_info ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: "
                            "no suitable certificate" ) );
        return( 0 );
    }
#endif

    *ciphersuite_info = suite_info;
    return( 0 );
}